

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::comparatorInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction)

{
  int comparator;
  int property;
  Molecule *mol;
  pointer ppAVar1;
  pointer ppRVar2;
  Atom *sd;
  RigidBody *sd_00;
  float comparisonValue;
  MoleculeIterator mi;
  SelectionSet bs;
  MoleculeIterator local_50;
  SelectionSet local_48;
  
  comparator = instruction->tok;
  property = instruction->intValue;
  comparisonValue = std::any_cast<float>(&instruction->value);
  createSelectionSets(&local_48,this);
  SelectionSet::clearAll(&local_48);
  local_50._M_node = (_Base_ptr)0x0;
  mol = SimInfo::beginMolecule(this->info,&local_50);
  while (mol != (Molecule *)0x0) {
    compareProperty(this,mol,&local_48,property,comparator,comparisonValue);
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar1 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021b42c;
    sd = (Atom *)0x0;
    while (sd != (Atom *)0x0) {
      compareProperty(this,&sd->super_StuntDouble,&local_48,property,comparator,comparisonValue);
      ppAVar1 = ppAVar1 + 1;
      sd = (Atom *)0x0;
      if (ppAVar1 !=
          (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021b42c:
        sd = *ppAVar1;
      }
    }
    ppRVar2 = (mol->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar2 !=
        (mol->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021b471;
    sd_00 = (RigidBody *)0x0;
    while (sd_00 != (RigidBody *)0x0) {
      compareProperty(this,&sd_00->super_StuntDouble,&local_48,property,comparator,comparisonValue);
      ppRVar2 = ppRVar2 + 1;
      sd_00 = (RigidBody *)0x0;
      if (ppRVar2 !=
          (mol->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021b471:
        sd_00 = *ppRVar2;
      }
    }
    mol = SimInfo::nextMolecule(this->info,&local_50);
  }
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_48);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_48.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::comparatorInstruction(
      const Token& instruction) {
    int comparator        = instruction.tok;
    int property          = instruction.intValue;
    float comparisonValue = std::any_cast<float>(instruction.value);
    SelectionSet bs       = createSelectionSets();
    bs.clearAll();

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      compareProperty(mol, bs, property, comparator, comparisonValue);

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        compareProperty(atom, bs, property, comparator, comparisonValue);
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        compareProperty(rb, bs, property, comparator, comparisonValue);
      }
    }

    return bs.parallelReduce();
  }